

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resWin.c
# Opt level: O2

Res_Win_t * Res_WinAlloc(void)

{
  Res_Win_t *pRVar1;
  Vec_Ptr_t *pVVar2;
  Vec_Vec_t *pVVar3;
  void **ppvVar4;
  long lVar5;
  
  pRVar1 = (Res_Win_t *)calloc(1,0x58);
  pRVar1->nFanoutLimit = 10;
  pRVar1->nLevTfiMinus = 3;
  pVVar2 = Vec_PtrAlloc(0x100);
  pRVar1->vRoots = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x100);
  pRVar1->vLeaves = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x100);
  pRVar1->vBranches = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x100);
  pRVar1->vNodes = pVVar2;
  pVVar2 = Vec_PtrAlloc(0x100);
  pRVar1->vDivs = pVVar2;
  pVVar3 = (Vec_Vec_t *)malloc(0x10);
  pVVar3->nCap = 0x80;
  ppvVar4 = (void **)malloc(0x400);
  pVVar3->pArray = ppvVar4;
  for (lVar5 = 0; lVar5 != 0x80; lVar5 = lVar5 + 1) {
    pVVar2 = Vec_PtrAlloc(0);
    ppvVar4[lVar5] = pVVar2;
  }
  pVVar3->nSize = 0x80;
  pRVar1->vMatrix = pVVar3;
  return pRVar1;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the window.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Res_Win_t * Res_WinAlloc()
{
    Res_Win_t * p;
    // start the manager
    p = ABC_ALLOC( Res_Win_t, 1 );
    memset( p, 0, sizeof(Res_Win_t) );
    // set internal parameters
    p->nFanoutLimit = 10;
    p->nLevTfiMinus =  3;
    // allocate storage
    p->vRoots    = Vec_PtrAlloc( 256 );
    p->vLeaves   = Vec_PtrAlloc( 256 );
    p->vBranches = Vec_PtrAlloc( 256 );
    p->vNodes    = Vec_PtrAlloc( 256 );
    p->vDivs     = Vec_PtrAlloc( 256 );
    p->vMatrix   = Vec_VecStart( 128 );
    return p;
}